

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t add_owner_id(archive_match *a,id_array *ids,int64_t id)

{
  ulong uVar1;
  wchar_t wVar2;
  void *pvVar3;
  long in_RDX;
  ulong *in_RSI;
  long in_RDI;
  void *p;
  uint i;
  uint local_24;
  
  if (*in_RSI <= in_RSI[1] + 1) {
    if (*in_RSI == 0) {
      *in_RSI = 8;
    }
    else {
      *in_RSI = *in_RSI << 1;
    }
    pvVar3 = realloc((void *)in_RSI[2],*in_RSI << 3);
    if (pvVar3 == (void *)0x0) {
      wVar2 = error_nomem((archive_match *)0x11cd12);
      return wVar2;
    }
    in_RSI[2] = (ulong)pvVar3;
  }
  local_24 = 0;
  while (((ulong)local_24 < in_RSI[1] && (*(long *)(in_RSI[2] + (ulong)local_24 * 8) < in_RDX))) {
    local_24 = local_24 + 1;
  }
  if ((ulong)local_24 == in_RSI[1]) {
    uVar1 = in_RSI[1];
    in_RSI[1] = uVar1 + 1;
    *(long *)(in_RSI[2] + uVar1 * 8) = in_RDX;
  }
  else if (*(long *)(in_RSI[2] + (ulong)local_24 * 8) != in_RDX) {
    memmove((void *)(in_RSI[2] + (ulong)(local_24 + 1) * 8),
            (void *)(in_RSI[2] + (ulong)local_24 * 8),(in_RSI[1] - (ulong)local_24) * 8);
    *(long *)(in_RSI[2] + (ulong)local_24 * 8) = in_RDX;
    in_RSI[1] = in_RSI[1] + 1;
  }
  *(uint *)(in_RDI + 0x70) = *(uint *)(in_RDI + 0x70) | 4;
  return L'\0';
}

Assistant:

static int
add_owner_id(struct archive_match *a, struct id_array *ids, int64_t id)
{
	unsigned i;

	if (ids->count + 1 >= ids->size) {
		void *p;

		if (ids->size == 0)
			ids->size = 8;
		else
			ids->size *= 2;
		p = realloc(ids->ids, sizeof(*ids->ids) * ids->size);
		if (p == NULL)
			return (error_nomem(a));
		ids->ids = (int64_t *)p;
	}

	/* Find an insert point. */
	for (i = 0; i < ids->count; i++) {
		if (ids->ids[i] >= id)
			break;
	}

	/* Add oowner id. */
	if (i == ids->count)
		ids->ids[ids->count++] = id;
	else if (ids->ids[i] != id) {
		memmove(&(ids->ids[i+1]), &(ids->ids[i]),
		    (ids->count - i) * sizeof(ids->ids[0]));
		ids->ids[i] = id;
		ids->count++;
	}
	a->setflag |= ID_IS_SET;
	return (ARCHIVE_OK);
}